

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_CustomComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  int iVar3;
  AActor *self;
  PClassActor *type;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  VMValue *pVVar8;
  AActor *pAVar9;
  PClassActor *pPVar10;
  char *pcVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  FName local_58;
  FSoundID local_54;
  DVector3 local_50;
  DAngle local_38;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = *(AActor **)&param->field_0;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
        }
        pPVar7 = (self->super_DThinker).super_DObject.Class;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar13) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar13 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cb7f6;
        }
      }
      if (numparam == 1) {
        pcVar11 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar10 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 == (PClassActor *)0x0) {
              pcVar11 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003cb872;
            }
          }
          if (numparam < 3) {
            pcVar11 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar11 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  dVar1 = param[2].field_0.f;
                  iVar5 = param[3].field_0.i;
                  if (numparam < 5) {
                    pVVar8 = defaultparam->Array;
                    if (pVVar8[4].field_0.field_3.Type != '\0') {
                      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003cb815;
                    }
                  }
                  else {
                    pVVar8 = param;
                    if (param[4].field_0.field_3.Type != '\0') {
                      pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb815:
                      __assert_fail(pcVar11,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x6d2,
                                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  iVar6 = pVVar8[4].field_0.i;
                  if (numparam < 6) {
                    pVVar8 = defaultparam->Array;
                    if (pVVar8[5].field_0.field_3.Type != '\0') {
                      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003cb834;
                    }
                  }
                  else {
                    pVVar8 = param;
                    if (param[5].field_0.field_3.Type != '\0') {
                      pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003cb834:
                      __assert_fail(pcVar11,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x6d3,
                                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  iVar2 = pVVar8[5].field_0.i;
                  if (numparam < 7) {
                    param = defaultparam->Array;
                    if (param[6].field_0.field_3.Type == '\0') goto LAB_003cb59f;
                    pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[6].field_0.field_3.Type == '\0') {
LAB_003cb59f:
                      pAVar9 = (self->target).field_0.p;
                      if (pAVar9 != (AActor *)0x0) {
                        if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                          iVar3 = param[6].field_0.i;
                          A_FaceTarget(self);
                          bVar13 = AActor::CheckMeleeRange(self);
                          if (bVar13) {
                            iVar12 = 0x89;
                            if (iVar2 != 0) {
                              iVar12 = iVar2;
                            }
                            if (iVar6 != 0) {
                              local_54.ID = iVar6;
                              S_Sound(self,1,&local_54,1.0,1.0);
                            }
                            pAVar9 = (self->target).field_0.p;
                            if ((pAVar9 != (AActor *)0x0) &&
                               (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                              (self->target).field_0.p = (AActor *)0x0;
                              pAVar9 = (AActor *)0x0;
                            }
                            local_38.Degrees = 0.0;
                            local_58.Index = iVar12;
                            iVar6 = P_DamageMobj(pAVar9,self,self,iVar5,&local_58,0,&local_38);
                            if (iVar3 != 0) {
                              if (0 < iVar6) {
                                iVar5 = iVar6;
                              }
                              pAVar9 = (self->target).field_0.p;
                              if ((pAVar9 != (AActor *)0x0) &&
                                 (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0))
                              {
                                (self->target).field_0.p = (AActor *)0x0;
                                pAVar9 = (AActor *)0x0;
                              }
                              P_TraceBleed(iVar5,pAVar9,self);
                            }
                          }
                          else if (type != (PClassActor *)0x0) {
                            dVar14 = AActor::GetBobOffset(self,0.0);
                            dVar1 = dVar1 + dVar14 + -32.0;
                            local_50.Z = (self->__Pos).Z + dVar1;
                            (self->__Pos).Z = local_50.Z;
                            local_50.X = (self->__Pos).X;
                            local_50.Y = (self->__Pos).Y;
                            local_50.Z = local_50.Z + 32.0;
                            pAVar9 = (self->target).field_0.p;
                            if ((pAVar9 != (AActor *)0x0) &&
                               (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                              (self->target).field_0.p = (AActor *)0x0;
                              pAVar9 = (AActor *)0x0;
                            }
                            pAVar9 = P_SpawnMissileXYZ(&local_50,self,pAVar9,type,false,
                                                       (AActor *)0x0);
                            (self->__Pos).Z = (self->__Pos).Z - dVar1;
                            if (pAVar9 != (AActor *)0x0) {
                              if (((pAVar9->flags2).Value & 0x40000000) != 0) {
                                (pAVar9->tracer).field_0 = (self->target).field_0;
                              }
                              P_CheckMissileSpawn(pAVar9,self->radius);
                            }
                          }
                        }
                        else {
                          (self->target).field_0.p = (AActor *)0x0;
                        }
                      }
                      return 0;
                    }
                    pcVar11 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar11,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x6d4,
                                "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar11 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x6d1,
                            "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar11 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x6d0,
                        "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar11 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003cb872:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6cf,
                    "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003cb7f6:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x6ce,
                "int AF_AActor_A_CustomComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS		(ti, AActor);
	PARAM_FLOAT		(spawnheight);
	PARAM_INT		(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange())
	{
		if (damagetype == NAME_None)
			damagetype = NAME_Melee;	// Melee is the default type
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (ti) 
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = spawnheight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, ti, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2 & MF2_SEEKERMISSILE)
			{
				missile->tracer = self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
	return 0;
}